

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall TasGrid::GridLocalPolynomial::clearGpuSurpluses(GridLocalPolynomial *this)

{
  CudaLocalPolynomialData<double> *this_00;
  CudaLocalPolynomialData<float> *this_01;
  
  this_00 = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaLocalPolynomialData<double>_*,_false>._M_head_impl;
  if (this_00 != (CudaLocalPolynomialData<double> *)0x0) {
    GpuVector<double>::clear(&this_00->surpluses);
  }
  this_01 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaLocalPolynomialData<float>,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaLocalPolynomialData<float>_*,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaLocalPolynomialData<float>_*,_false>._M_head_impl;
  if (this_01 != (CudaLocalPolynomialData<float> *)0x0) {
    GpuVector<float>::clear(&this_01->surpluses);
    return;
  }
  return;
}

Assistant:

void GridLocalPolynomial::clearGpuSurpluses(){
    if (gpu_cache) gpu_cache->surpluses.clear();
    if (gpu_cachef) gpu_cachef->surpluses.clear();
}